

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  void *pvVar1;
  void *pvVar2;
  size_t sVar3;
  int *piVar4;
  mtree *mtree;
  ssize_t bytes_read;
  size_t bytes_to_read;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  if (*(int *)((long)pvVar1 + 0x30) < 0) {
    *buff = (void *)0x0;
    *offset = 0;
    *size = 0;
    a_local._4_4_ = 1;
  }
  else {
    if (*(long *)((long)pvVar1 + 0x20) == 0) {
      *(undefined8 *)((long)pvVar1 + 0x18) = 0x10000;
      pvVar2 = malloc(*(size_t *)((long)pvVar1 + 0x18));
      *(void **)((long)pvVar1 + 0x20) = pvVar2;
      if (*(long *)((long)pvVar1 + 0x20) == 0) {
        archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
        return -0x1e;
      }
    }
    *buff = *(void **)((long)pvVar1 + 0x20);
    *offset = *(int64_t *)((long)pvVar1 + 0x28);
    if (*(long *)((long)pvVar1 + 0x2088) - *(long *)((long)pvVar1 + 0x28) <
        *(long *)((long)pvVar1 + 0x18)) {
      bytes_read = *(long *)((long)pvVar1 + 0x2088) - *(long *)((long)pvVar1 + 0x28);
    }
    else {
      bytes_read = *(ssize_t *)((long)pvVar1 + 0x18);
    }
    sVar3 = read(*(int *)((long)pvVar1 + 0x30),*(void **)((long)pvVar1 + 0x20),bytes_read);
    if ((long)sVar3 < 0) {
      piVar4 = __errno_location();
      archive_set_error(&a->archive,*piVar4,"Can\'t read");
      a_local._4_4_ = -0x14;
    }
    else if (sVar3 == 0) {
      *size = 0;
      a_local._4_4_ = 1;
    }
    else {
      *(size_t *)((long)pvVar1 + 0x28) = sVar3 + *(long *)((long)pvVar1 + 0x28);
      *size = sVar3;
      a_local._4_4_ = 0;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
read_data(struct archive_read *a, const void **buff, size_t *size,
    int64_t *offset)
{
	size_t bytes_to_read;
	ssize_t bytes_read;
	struct mtree *mtree;

	mtree = (struct mtree *)(a->format->data);
	if (mtree->fd < 0) {
		*buff = NULL;
		*offset = 0;
		*size = 0;
		return (ARCHIVE_EOF);
	}
	if (mtree->buff == NULL) {
		mtree->buffsize = 64 * 1024;
		mtree->buff = malloc(mtree->buffsize);
		if (mtree->buff == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
			return (ARCHIVE_FATAL);
		}
	}

	*buff = mtree->buff;
	*offset = mtree->offset;
	if ((int64_t)mtree->buffsize > mtree->cur_size - mtree->offset)
		bytes_to_read = (size_t)(mtree->cur_size - mtree->offset);
	else
		bytes_to_read = mtree->buffsize;
	bytes_read = read(mtree->fd, mtree->buff, bytes_to_read);
	if (bytes_read < 0) {
		archive_set_error(&a->archive, errno, "Can't read");
		return (ARCHIVE_WARN);
	}
	if (bytes_read == 0) {
		*size = 0;
		return (ARCHIVE_EOF);
	}
	mtree->offset += bytes_read;
	*size = bytes_read;
	return (ARCHIVE_OK);
}